

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int wb_write_out(archive_write *a)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  archive_write *a_00;
  size_t in_RDI;
  int r;
  void *unaff_retaddr;
  size_t nw;
  size_t wsize;
  iso9660_conflict *iso9660;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_RDI + 0xd0);
  uVar3 = 0x10000 - *(long *)(lVar1 + 0x102e0);
  a_00 = (archive_write *)(uVar3 & 0x7ff);
  if (*(int *)(lVar1 + 0x102e8) == 0) {
    iVar2 = __archive_write_output
                      (a_00,(void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       0x17f9be);
  }
  else {
    iVar2 = write_to_temp((archive_write *)nw,unaff_retaddr,in_RDI);
  }
  *(ulong *)(lVar1 + 0x102f0) = (uVar3 - (long)a_00) + *(long *)(lVar1 + 0x102f0);
  if (*(long *)(lVar1 + 0x102f8) < *(long *)(lVar1 + 0x102f0)) {
    *(undefined8 *)(lVar1 + 0x102f8) = *(undefined8 *)(lVar1 + 0x102f0);
  }
  *(undefined8 *)(lVar1 + 0x102e0) = 0x10000;
  if (a_00 != (archive_write *)0x0) {
    *(long *)(lVar1 + 0x102e0) = *(long *)(lVar1 + 0x102e0) - (long)a_00;
    memmove((void *)(lVar1 + 0x2dc),(void *)((lVar1 + 0x2dc + uVar3) - (long)a_00),(size_t)a_00);
  }
  return iVar2;
}

Assistant:

static int
wb_write_out(struct archive_write *a)
{
	struct iso9660 *iso9660 = (struct iso9660 *)a->format_data;
	size_t wsize, nw;
	int r;

	wsize = sizeof(iso9660->wbuff) - iso9660->wbuff_remaining;
	nw = wsize % LOGICAL_BLOCK_SIZE;
	if (iso9660->wbuff_type == WB_TO_STREAM)
		r = __archive_write_output(a, iso9660->wbuff, wsize - nw);
	else
		r = write_to_temp(a, iso9660->wbuff, wsize - nw);
	/* Increase the offset. */
	iso9660->wbuff_offset += wsize - nw;
	if (iso9660->wbuff_offset > iso9660->wbuff_written)
		iso9660->wbuff_written = iso9660->wbuff_offset;
	iso9660->wbuff_remaining = sizeof(iso9660->wbuff);
	if (nw) {
		iso9660->wbuff_remaining -= nw;
		memmove(iso9660->wbuff, iso9660->wbuff + wsize - nw, nw);
	}
	return (r);
}